

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_get.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::StatisticsPropagator::PropagateTableFilter
          (StatisticsPropagator *this,ColumnBinding stats_binding,BaseStatistics *stats,
          TableFilter *filter)

{
  FilterPropagateResult FVar1;
  int iVar2;
  ExpressionFilter *pEVar3;
  type pBVar4;
  type condition;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  long *local_38;
  ColumnBinding local_30;
  
  local_30.column_index = stats_binding.column_index;
  local_30.table_index = stats_binding.table_index;
  if (filter->filter_type == EXPRESSION_FILTER) {
    pEVar3 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
              ((duckdb *)&local_38,&stats->type,&local_30);
    pBVar4 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
             ::operator*((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                          *)&local_38);
    (*(pEVar3->super_TableFilter)._vptr_TableFilter[6])(&local_40,pEVar3,pBVar4);
    condition = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_40);
    UpdateFilterStatistics(this,condition);
    FVar1 = HandleFilter(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_40);
    if (local_40._M_head_impl != (Expression *)0x0) {
      (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    return FVar1;
  }
  iVar2 = (*filter->_vptr_TableFilter[2])(filter,stats);
  return (FilterPropagateResult)iVar2;
}

Assistant:

FilterPropagateResult StatisticsPropagator::PropagateTableFilter(ColumnBinding stats_binding, BaseStatistics &stats,
                                                                 TableFilter &filter) {
	if (filter.filter_type == TableFilterType::EXPRESSION_FILTER) {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto column_ref = make_uniq<BoundColumnRefExpression>(stats.GetType(), stats_binding);
		auto filter_expr = expr_filter.ToExpression(*column_ref);
		UpdateFilterStatistics(*filter_expr);
		return HandleFilter(filter_expr);
	}
	return filter.CheckStatistics(stats);
}